

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

void SwapUVPlane(uint8_t *src_uv,int src_stride_uv,uint8_t *dst_vu,int dst_stride_vu,int width,
                int height)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  code *pcVar4;
  bool bVar5;
  int local_40;
  int local_3c;
  
  iVar1 = height;
  if (height < 0) {
    iVar1 = -height;
    src_uv = src_uv + ~height * src_stride_uv;
    src_stride_uv = -src_stride_uv;
  }
  local_40 = src_stride_uv;
  local_3c = dst_stride_vu;
  if (width * 2 == dst_stride_vu && src_stride_uv == width * 2) {
    width = iVar1 * width;
    iVar1 = 1;
    local_40 = 0;
    local_3c = 0;
  }
  iVar2 = libyuv::TestCpuFlag(0x40);
  if ((width & 0xfU) == 0) {
    pcVar4 = SwapUVRow_SSSE3;
  }
  else {
    pcVar4 = SwapUVRow_Any_SSSE3;
  }
  if (iVar2 == 0) {
    pcVar4 = SwapUVRow_C;
  }
  iVar2 = libyuv::TestCpuFlag(0x400);
  if ((width & 0x1fU) == 0) {
    pcVar3 = SwapUVRow_AVX2;
  }
  else {
    pcVar3 = SwapUVRow_Any_AVX2;
  }
  if (iVar2 == 0) {
    pcVar3 = pcVar4;
  }
  while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
    (*pcVar3)(src_uv,dst_vu,width);
    src_uv = src_uv + local_40;
    dst_vu = dst_vu + local_3c;
  }
  return;
}

Assistant:

LIBYUV_API
void SwapUVPlane(const uint8_t* src_uv,
                 int src_stride_uv,
                 uint8_t* dst_vu,
                 int dst_stride_vu,
                 int width,
                 int height) {
  int y;
  void (*SwapUVRow)(const uint8_t* src_uv, uint8_t* dst_vu, int width) =
      SwapUVRow_C;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_uv = src_uv + (height - 1) * src_stride_uv;
    src_stride_uv = -src_stride_uv;
  }
  // Coalesce rows.
  if (src_stride_uv == width * 2 && dst_stride_vu == width * 2) {
    width *= height;
    height = 1;
    src_stride_uv = dst_stride_vu = 0;
  }

#if defined(HAS_SWAPUVROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    SwapUVRow = SwapUVRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      SwapUVRow = SwapUVRow_SSSE3;
    }
  }
#endif
#if defined(HAS_SWAPUVROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    SwapUVRow = SwapUVRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      SwapUVRow = SwapUVRow_AVX2;
    }
  }
#endif
#if defined(HAS_SWAPUVROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SwapUVRow = SwapUVRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      SwapUVRow = SwapUVRow_NEON;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    SwapUVRow(src_uv, dst_vu, width);
    src_uv += src_stride_uv;
    dst_vu += dst_stride_vu;
  }
}